

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetVariableByName
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,
          char *Name)

{
  undefined *puVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  Uint32 UVar5;
  PipelineResourceSignatureGLImpl *this_00;
  PipelineResourceSignatureDesc *Args_6;
  undefined8 uVar6;
  reference pvVar7;
  Char *Message;
  char (*in_stack_ffffffffffffff38) [3];
  undefined1 local_a0 [8];
  string msg;
  int MgrInd;
  Int32 ShaderInd;
  char *local_68;
  Char *local_60;
  undefined1 local_58 [8];
  string _msg;
  char *pcStack_30;
  PIPELINE_TYPE PipelineType;
  char *Name_local;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *pSStack_20;
  SHADER_TYPE ShaderType_local;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this_local;
  
  pcStack_30 = Name;
  Name_local._4_4_ = ShaderType;
  pSStack_20 = this;
  _msg.field_2._M_local_buf[0xf] = GetPipelineType(this);
  bVar2 = IsConsistentShaderType(Name_local._4_4_,_msg.field_2._M_local_buf[0xf]);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(Name_local._4_4_,_msg.field_2._M_local_buf[0xf]);
    pvVar7 = std::array<signed_char,_6UL>::operator[](&this->m_ActiveShaderStageIndex,(long)IVar3);
    uVar4 = (uint)*pvVar7;
    if ((int)uVar4 < 0) {
      this_local = (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)0x0;
    }
    else {
      msg.field_2._12_4_ = uVar4;
      UVar5 = GetNumShaders(this);
      if (UVar5 <= uVar4) {
        FormatString<char[26],char[46]>
                  ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(MgrInd) < GetNumShaders()",
                   (char (*) [46])(ulong)UVar5);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetVariableByName",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                   ,0xc3);
        std::__cxx11::string::~string((string *)local_a0);
      }
      this_local = (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)
                   ShaderVariableManagerGL::GetVariable
                             (this->m_pShaderVarMgrs + (int)msg.field_2._12_4_,pcStack_30);
    }
  }
  else {
    local_60 = GetShaderTypeLiteralName(Name_local._4_4_);
    local_68 = GetPipelineTypeString(_msg.field_2._M_local_buf[0xf]);
    this_00 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->(&this->m_pPRS);
    Args_6 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)this_00);
    FormatString<char[42],char_const*,char[19],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              ((string *)local_58,(Diligent *)"Unable to find mutable/dynamic variable \'",
               (char (*) [42])&stack0xffffffffffffffd0,(char **)"\' in shader stage ",
               (char (*) [19])&local_60,(char **)" as the stage is invalid for ",
               (char (*) [30])&local_68,(char **)0xf509b1,(char (*) [31])Args_6,(char **)"\'.",
               in_stack_ffffffffffffff38);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_58);
    this_local = (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)0x0;
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

GetVariableByName(SHADER_TYPE ShaderType, const char* Name) override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        if (!IsConsistentShaderType(ShaderType, PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to find mutable/dynamic variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(PipelineType), " pipeline resource signature '", m_pPRS->GetDesc().Name, "'.");
            return nullptr;
        }

        const Int32 ShaderInd = GetShaderTypePipelineIndex(ShaderType, PipelineType);
        const int   MgrInd    = m_ActiveShaderStageIndex[ShaderInd];
        if (MgrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(MgrInd) < GetNumShaders());
        return m_pShaderVarMgrs[MgrInd].GetVariable(Name);
    }